

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O1

void __thiscall sznet::TimerQueue::cancelInLoop(TimerQueue *this,TimerId timerId)

{
  EventLoop *this_00;
  _Manager_type p_Var1;
  bool bVar2;
  int iVar3;
  iterator __position;
  Timer *e;
  undefined1 local_38 [8];
  ActiveTimer timer;
  
  e = timerId.m_timer;
  this_00 = this->m_loop;
  bVar2 = net::EventLoop::isInLoopThread(this_00);
  if (!bVar2) {
    net::EventLoop::abortNotInLoopThread(this_00);
  }
  if ((this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      (ulong)(this->m_timerMinHeap).m_size) {
    __assert_fail("m_timerMinHeap.size() == m_activeTimers.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                  ,0x50,"void sznet::TimerQueue::cancelInLoop(TimerId)");
  }
  local_38 = (undefined1  [8])e;
  timer.first = (Timer *)timerId.m_sequence;
  __position = std::
               _Rb_tree<std::pair<sznet::Timer_*,_long>,_std::pair<sznet::Timer_*,_long>,_std::_Identity<std::pair<sznet::Timer_*,_long>_>,_std::less<std::pair<sznet::Timer_*,_long>_>,_std::allocator<std::pair<sznet::Timer_*,_long>_>_>
               ::find(&(this->m_activeTimers)._M_t,(key_type *)local_38);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header) {
    iVar3 = MinHeap<sznet::Timer>::erase(&this->m_timerMinHeap,e);
    if (iVar3 != 0) {
      __assert_fail("m_timerMinHeap.erase(timerId.m_timer) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                    ,0x55,"void sznet::TimerQueue::cancelInLoop(TimerId)");
    }
    if (e != (Timer *)0x0) {
      p_Var1 = (e->m_callback).super__Function_base._M_manager;
      if (p_Var1 != (_Manager_type)0x0) {
        (*p_Var1)((_Any_data *)&e->m_callback,(_Any_data *)&e->m_callback,__destroy_functor);
      }
      operator_delete(e);
    }
    std::
    _Rb_tree<std::pair<sznet::Timer*,long>,std::pair<sznet::Timer*,long>,std::_Identity<std::pair<sznet::Timer*,long>>,std::less<std::pair<sznet::Timer*,long>>,std::allocator<std::pair<sznet::Timer*,long>>>
    ::erase_abi_cxx11_((_Rb_tree<std::pair<sznet::Timer*,long>,std::pair<sznet::Timer*,long>,std::_Identity<std::pair<sznet::Timer*,long>>,std::less<std::pair<sznet::Timer*,long>>,std::allocator<std::pair<sznet::Timer*,long>>>
                        *)&this->m_activeTimers,(const_iterator)__position._M_node);
  }
  if ((this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      (ulong)(this->m_timerMinHeap).m_size) {
    return;
  }
  __assert_fail("m_timerMinHeap.size() == m_activeTimers.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/time/TimerQueue.cpp"
                ,0x5c,"void sznet::TimerQueue::cancelInLoop(TimerId)");
}

Assistant:

void TimerQueue::cancelInLoop(TimerId timerId)
{
	m_loop->assertInLoopThread();
	assert(m_timerMinHeap.size() == m_activeTimers.size());
	ActiveTimer timer(timerId.m_timer, timerId.m_sequence);
	ActiveTimerSet::iterator it = m_activeTimers.find(timer);
	if (it != m_activeTimers.end())
	{
		assert(m_timerMinHeap.erase(timerId.m_timer) == 0);
		// FIXME move to a free list
		// FIXME: no delete please
		delete timerId.m_timer;
		timerId.m_timer = nullptr;
		m_activeTimers.erase(it);
	}
	assert(m_timerMinHeap.size() == m_activeTimers.size());
}